

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.c
# Opt level: O0

int countVariables(Node *node)

{
  int local_14;
  Node *pNStack_10;
  int count;
  Node *node_local;
  
  local_14 = 0;
  for (pNStack_10 = node; pNStack_10 != (Node *)0x0; pNStack_10 = (pNStack_10->rule).next) {
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

static int countVariables(Node *node)
{
  int count= 0;
  while (node)
    {
      ++count;
      node= node->variable.next;
    }
  return count;
}